

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool kwssys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + str->_M_string_length);
  uVar5 = 0;
  do {
    uVar3 = uVar5;
    uVar2 = local_48;
    if (local_48 <= uVar3) break;
    uVar4 = std::__cxx11::string::find((char)(string *)&local_50,10);
    if (uVar4 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                 &local_70);
      uVar5 = uVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    else {
      if ((uVar3 < uVar4) && (local_50[uVar4 - 1] == '\r')) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                   &local_70);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                   &local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar5 = uVar4 + 1;
    }
  } while (uVar4 != 0xffffffffffffffff);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return uVar2 <= uVar3;
}

Assistant:

bool SystemTools::Split(const std::string& str,
                        std::vector<std::string>& lines)
{
  std::string data(str);
  std::string::size_type lpos = 0;
  while (lpos < data.length()) {
    std::string::size_type rpos = data.find_first_of('\n', lpos);
    if (rpos == std::string::npos) {
      // Line ends at end of string without a newline.
      lines.push_back(data.substr(lpos));
      return false;
    }
    if ((rpos > lpos) && (data[rpos - 1] == '\r')) {
      // Line ends in a "\r\n" pair, remove both characters.
      lines.push_back(data.substr(lpos, (rpos - 1) - lpos));
    } else {
      // Line ends in a "\n", remove the character.
      lines.push_back(data.substr(lpos, rpos - lpos));
    }
    lpos = rpos + 1;
  }
  return true;
}